

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53l1x.cpp
# Opt level: O2

int __thiscall VL53L1X::init(VL53L1X *this,EVP_PKEY_CTX *ctx)

{
  I2Cgeneric *pIVar1;
  byte bVar2;
  bool bVar3;
  uint16_t uVar4;
  
  uVar4 = readReg16Bit(this,0x10f);
  if (uVar4 == 0xeacc) {
    sleep(1);
    startTimeout(this);
    do {
      bVar2 = readReg(this,0xe5);
      if ((bVar2 & 1) != 0) {
        if ((this->super_VL53LXX).ioMode2v8 == true) {
          bVar2 = readReg(this,0x2e);
          pIVar1 = (this->super_VL53LXX).i2c;
          (*pIVar1->_vptr_I2Cgeneric[0x20])(pIVar1,0x2e,(ulong)(bVar2 | 1));
        }
        uVar4 = readReg16Bit(this,6);
        this->fast_osc_frequency = uVar4;
        uVar4 = readReg16Bit(this,0xde);
        this->osc_calibrate_val = uVar4;
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x21])(pIVar1,0x24,0xa00);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x20])(pIVar1,0x31,2);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x20])(pIVar1,0x36,8);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x20])(pIVar1,0x37,0x10);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x20])(pIVar1,0x39,1);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x20])(pIVar1,0x3e,0xff);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x20])(pIVar1,0x3f,0);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x20])(pIVar1,0x40,2);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x21])(pIVar1,0x50,0);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x21])(pIVar1,0x52,0);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x20])(pIVar1,0x57,0x38);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x21])(pIVar1,100,0x168);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x21])(pIVar1,0x66,0xc0);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x20])(pIVar1,0x71,1);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x20])(pIVar1,0x7c,1);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x20])(pIVar1,0x7e,2);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x20])(pIVar1,0x82,0);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x20])(pIVar1,0x77,1);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x20])(pIVar1,0x81,0x8b);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x21])(pIVar1,0x54,0xc800);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x20])(pIVar1,0x4f,2);
        setDistanceMode(this,this->range_mode);
        setMeasurementTimingBudget(this,this->timing_budget);
        uVar4 = readReg16Bit(this,0x22);
        pIVar1 = (this->super_VL53LXX).i2c;
        (*pIVar1->_vptr_I2Cgeneric[0x21])(pIVar1,0x1e,(ulong)((uVar4 & 0x3fff) << 2));
        return (int)CONCAT71((int7)((ulong)this >> 8),1);
      }
      bVar3 = checkTimeoutExpired(this);
    } while (!bVar3);
    this->did_timeout = true;
    puts("ERROR: bad firmware status! ");
  }
  else {
    printf("ERROR: Wrong identification model ID (%u)! \n",(ulong)uVar4);
  }
  return 0;
}

Assistant:

bool VL53L1X::init()
{
  // check model ID and module type registers (values specified in datasheet)
  uint16_t model_id = readReg16Bit(VL53L1X_DEFINITIONS::IDENTIFICATION__MODEL_ID);
  if (model_id != 0xEACC) {
    printf("ERROR: Wrong identification model ID (%u)! \n", model_id);
    return false;
  }

  // VL53L1_software_reset() begin

  // give it some time to boot; otherwise the sensor NACKs during the readReg()
  // call below and the Arduino 101 doesn't seem to handle that well
  sleep(1);

  // VL53L1_poll_for_boot_completion() begin

  startTimeout();

  // check last_status in case we still get a NACK to try to deal with it correctly
  while ((readReg(VL53L1X_DEFINITIONS::FIRMWARE__SYSTEM_STATUS) & 0x01) == 0 )
  {
    if (checkTimeoutExpired())
    {
      did_timeout = true;
      printf("ERROR: bad firmware status! \n");
      return false;
    }
  }
  
  // VL53L1_poll_for_boot_completion() end

  // VL53L1_software_reset() end

  // VL53L1_DataInit() begin

  // sensor uses 1V8 mode for I/O by default; switch to 2V8 mode if necessary
  if (this->ioMode2v8)
  {
    writeReg(VL53L1X_DEFINITIONS::PAD_I2C_HV__EXTSUP_CONFIG,
      readReg(VL53L1X_DEFINITIONS::PAD_I2C_HV__EXTSUP_CONFIG) | 0x01);
  }

  // store oscillator info for later use
  fast_osc_frequency = readReg16Bit(VL53L1X_DEFINITIONS::OSC_MEASURED__FAST_OSC__FREQUENCY);
  osc_calibrate_val = readReg16Bit(VL53L1X_DEFINITIONS::RESULT__OSC_CALIBRATE_VAL);

  // VL53L1_DataInit() end

  // VL53L1_StaticInit() begin

  // Note that the API does not actually apply the configuration settings below
  // when VL53L1_StaticInit() is called: it keeps a copy of the sensor's
  // register contents in memory and doesn't actually write them until a
  // measurement is started. Writing the configuration here means we don't have
  // to keep it all in memory and avoids a lot of redundant writes later.

  // the API sets the preset mode to LOWPOWER_AUTONOMOUS here:
  // VL53L1_set_preset_mode() begin

  // VL53L1_preset_mode_standard_ranging() begin

  // values labeled "tuning parm default" are from vl53l1_tuning_parm_defaults.h
  // (API uses these in VL53L1_init_tuning_parm_storage_struct())

  // static config
  // API resets PAD_I2C_HV__EXTSUP_CONFIG here, but maybe we don't want to do
  // that? (seems like it would disable 2V8 mode)
  writeReg16Bit(VL53L1X_DEFINITIONS::DSS_CONFIG__TARGET_TOTAL_RATE_MCPS, TargetRate); // should already be this value after reset
  writeReg(VL53L1X_DEFINITIONS::GPIO__TIO_HV_STATUS, 0x02);
  writeReg(VL53L1X_DEFINITIONS::SIGMA_ESTIMATOR__EFFECTIVE_PULSE_WIDTH_NS, 8); // tuning parm default
  writeReg(VL53L1X_DEFINITIONS::SIGMA_ESTIMATOR__EFFECTIVE_AMBIENT_WIDTH_NS, 16); // tuning parm default
  writeReg(VL53L1X_DEFINITIONS::ALGO__CROSSTALK_COMPENSATION_VALID_HEIGHT_MM, 0x01);
  writeReg(VL53L1X_DEFINITIONS::ALGO__RANGE_IGNORE_VALID_HEIGHT_MM, 0xFF);
  writeReg(VL53L1X_DEFINITIONS::ALGO__RANGE_MIN_CLIP, 0); // tuning parm default
  writeReg(VL53L1X_DEFINITIONS::ALGO__CONSISTENCY_CHECK__TOLERANCE, 2); // tuning parm default

  // general config
  writeReg16Bit(VL53L1X_DEFINITIONS::SYSTEM__THRESH_RATE_HIGH, 0x0000);
  writeReg16Bit(VL53L1X_DEFINITIONS::SYSTEM__THRESH_RATE_LOW, 0x0000);
  writeReg(VL53L1X_DEFINITIONS::DSS_CONFIG__APERTURE_ATTENUATION, 0x38);

  // timing config
  // most of these settings will be determined later by distance and timing
  // budget configuration
  writeReg16Bit(VL53L1X_DEFINITIONS::RANGE_CONFIG__SIGMA_THRESH, 360); // tuning parm default
  writeReg16Bit(VL53L1X_DEFINITIONS::RANGE_CONFIG__MIN_COUNT_RATE_RTN_LIMIT_MCPS, 192); // tuning parm default

  // dynamic config

  writeReg(VL53L1X_DEFINITIONS::SYSTEM__GROUPED_PARAMETER_HOLD_0, 0x01);
  writeReg(VL53L1X_DEFINITIONS::SYSTEM__GROUPED_PARAMETER_HOLD_1, 0x01);
  writeReg(VL53L1X_DEFINITIONS::SD_CONFIG__QUANTIFIER, 2); // tuning parm default

  // VL53L1_preset_mode_standard_ranging() end

  // from VL53L1_preset_mode_timed_ranging_*
  // GPH is 0 after reset, but writing GPH0 and GPH1 above seem to set GPH to 1,
  // and things don't seem to work if we don't set GPH back to 0 (which the API
  // does here).
  writeReg(VL53L1X_DEFINITIONS::SYSTEM__GROUPED_PARAMETER_HOLD, 0x00);
  writeReg(VL53L1X_DEFINITIONS::SYSTEM__SEED_CONFIG, 1); // tuning parm default

  // from VL53L1_config_low_power_auto_mode
  writeReg(VL53L1X_DEFINITIONS::SYSTEM__SEQUENCE_CONFIG, 0x8B); // VHV, PHASECAL, DSS1, RANGE
  writeReg16Bit(VL53L1X_DEFINITIONS::DSS_CONFIG__MANUAL_EFFECTIVE_SPADS_SELECT, 200 << 8);
  writeReg(VL53L1X_DEFINITIONS::DSS_CONFIG__ROI_MODE_CONTROL, 2); // REQUESTED_EFFFECTIVE_SPADS

  // VL53L1_set_preset_mode() end

  // default to long range, 50 ms timing budget
  // note that this is different than what the API defaults to
  setDistanceMode((VL53L1X_DEFINITIONS::DistanceMode)this->range_mode);
  setMeasurementTimingBudget(this->timing_budget);

  // VL53L1_StaticInit() end

  // the API triggers this change in VL53L1_init_and_start_range() once a
  // measurement is started; assumes MM1 and MM2 are disabled
  writeReg16Bit(VL53L1X_DEFINITIONS::ALGO__PART_TO_PART_RANGE_OFFSET_MM,
    readReg16Bit(VL53L1X_DEFINITIONS::MM_CONFIG__OUTER_OFFSET_MM) * 4);

  return true;
}